

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_cast_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::AddCastToTypeInternal
          (duckdb *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr,
          LogicalType *target_type,CastFunctionSet *cast_functions,GetCastFunctionInput *get_input,
          bool try_cast)

{
  shared_ptr<duckdb::BoundParameterData,_true> *this_00;
  ExpressionClass EVar1;
  LogicalTypeId LVar2;
  bool bVar3;
  pointer pEVar4;
  BoundParameterExpression *pBVar5;
  BoundParameterData *pBVar6;
  BoundDefaultExpression *pBVar7;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_68;
  BoundCastInfo local_60;
  BoundCastInfo local_48;
  
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expr);
  EVar1 = (pEVar4->super_BaseExpression).expression_class;
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expr);
  if (EVar1 != BOUND_PARAMETER) {
    if ((pEVar4->super_BaseExpression).expression_class == BOUND_DEFAULT) {
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(expr);
      pBVar7 = BaseExpression::Cast<duckdb::BoundDefaultExpression>(&pEVar4->super_BaseExpression);
      LogicalType::operator=(&(pBVar7->super_Expression).return_type,target_type);
    }
    bVar3 = LogicalType::IsValid(target_type);
    if (bVar3) {
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(expr);
      CastFunctionSet::GetCastFunction
                (&local_60,cast_functions,&pEVar4->return_type,target_type,get_input);
      local_68._M_head_impl =
           (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      local_48.function = local_60.function;
      local_48.init_local_state = local_60.init_local_state;
      local_48.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
           local_60.cast_data.
           super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
           .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
      local_60.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
           (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
            )0x0;
      AddCastExpressionInternal
                (this,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)&local_68,target_type,&local_48,try_cast);
      if (local_48.cast_data.
          super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
          super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
          .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
           )0x0) {
        (*(*(_func_int ***)
            local_48.cast_data.
            super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
            _M_t.
            super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
            .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl)[1])();
      }
      local_48.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
           (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
            )0x0;
      if (local_68._M_head_impl != (Expression *)0x0) {
        (*((local_68._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_68._M_head_impl = (Expression *)0x0;
      if (local_60.cast_data.
          super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
          super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
          .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl ==
          (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
           )0x0) {
        return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
      }
      (**(code **)(*(long *)local_60.cast_data.
                            super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
                            .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl + 8)
      )();
      return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
    }
    goto LAB_015dcfd4;
  }
  pBVar5 = BaseExpression::Cast<duckdb::BoundParameterExpression>(&pEVar4->super_BaseExpression);
  bVar3 = LogicalType::IsValid(target_type);
  if (bVar3) {
    this_00 = &pBVar5->parameter_data;
    pBVar6 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
    if ((pBVar6->return_type).id_ != INVALID) {
      pBVar6 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
      LVar2 = (pBVar6->return_type).id_;
      pBVar6 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
      if (LVar2 == UNKNOWN) {
        LogicalType::operator=(&pBVar6->return_type,target_type);
      }
      else {
        bVar3 = LogicalType::operator==(&pBVar6->return_type,target_type);
        if (!bVar3) {
          LogicalType::LogicalType((LogicalType *)&local_60,INVALID);
          pBVar6 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
          goto LAB_015dcfa9;
        }
        pBVar6 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
        target_type = &pBVar6->return_type;
      }
    }
  }
  else {
    LogicalType::LogicalType((LogicalType *)&local_60,INVALID);
    pBVar6 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(&pBVar5->parameter_data);
LAB_015dcfa9:
    LogicalType::operator=(&pBVar6->return_type,(LogicalType *)&local_60);
    LogicalType::~LogicalType((LogicalType *)&local_60);
  }
  LogicalType::operator=(&(pBVar5->super_Expression).return_type,target_type);
LAB_015dcfd4:
  *(Expression **)this =
       (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> AddCastToTypeInternal(unique_ptr<Expression> expr, const LogicalType &target_type,
                                             CastFunctionSet &cast_functions, GetCastFunctionInput &get_input,
                                             bool try_cast) {
	D_ASSERT(expr);
	if (expr->GetExpressionClass() == ExpressionClass::BOUND_PARAMETER) {
		auto &parameter = expr->Cast<BoundParameterExpression>();
		if (!target_type.IsValid()) {
			// invalidate the parameter
			parameter.parameter_data->return_type = LogicalType::INVALID;
			parameter.return_type = target_type;
			return expr;
		}
		if (parameter.parameter_data->return_type.id() == LogicalTypeId::INVALID) {
			// we don't know the type of this parameter
			parameter.return_type = target_type;
			return expr;
		}
		if (parameter.parameter_data->return_type.id() == LogicalTypeId::UNKNOWN) {
			// prepared statement parameter cast - but there is no type, convert the type
			parameter.parameter_data->return_type = target_type;
			parameter.return_type = target_type;
			return expr;
		}
		// prepared statement parameter already has a type
		if (parameter.parameter_data->return_type == target_type) {
			// this type! we are done
			parameter.return_type = parameter.parameter_data->return_type;
			return expr;
		}
		// invalidate the type
		parameter.parameter_data->return_type = LogicalType::INVALID;
		parameter.return_type = target_type;
		return expr;
	} else if (expr->GetExpressionClass() == ExpressionClass::BOUND_DEFAULT) {
		D_ASSERT(target_type.IsValid());
		auto &def = expr->Cast<BoundDefaultExpression>();
		def.return_type = target_type;
	}
	if (!target_type.IsValid()) {
		return expr;
	}

	auto cast_function = cast_functions.GetCastFunction(expr->return_type, target_type, get_input);
	return AddCastExpressionInternal(std::move(expr), target_type, std::move(cast_function), try_cast);
}